

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O1

double __thiscall crnlib::random::gaussian(random *this,double mean,double stddev)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  uint32 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  do {
    do {
      uVar4 = urand32(this);
      dVar5 = (double)uVar4 * 2.3283064365386963e-10 + 0.0;
      dVar8 = 1.0;
      if (dVar5 <= 1.0) {
        dVar8 = dVar5;
      }
      uVar4 = urand32(this);
      dVar5 = (double)uVar4 * 2.3283064365386963e-10 + 0.0;
      dVar6 = 1.0;
      if (dVar5 <= 1.0) {
        dVar6 = dVar5;
      }
      bVar1 = 0.0 < dVar8;
      bVar2 = 0.0 < dVar6;
      dVar5 = 1.0;
      if (bVar2 && bVar1) {
        dVar5 = dVar8;
      }
      dVar6 = (dVar6 + -0.5) * 1.7156;
      dVar8 = 0.8578;
      if (bVar2 && bVar1) {
        dVar8 = dVar6;
      }
      dVar3 = dVar5 + -0.449871;
      dVar7 = 1.244395;
      if (bVar2 && bVar1) {
        dVar7 = ABS(dVar6) + 0.386595;
      }
      dVar6 = (dVar3 * -0.25472 + dVar7 * 0.196) * dVar7 + dVar3 * dVar3;
      if (dVar6 < 0.27597) goto LAB_00151a4d;
    } while (0.27846 < dVar6);
    dVar6 = log(dVar5);
  } while (dVar6 * -4.0 * dVar5 * dVar5 < dVar8 * dVar8);
LAB_00151a4d:
  return (dVar8 * stddev) / dVar5 + mean;
}

Assistant:

double random::gaussian(double mean, double stddev) {
  double q, u, v, x, y;

  /*
      Generate P = (u,v) uniform in rect. enclosing acceptance region
      Make sure that any random numbers <= 0 are rejected, since
      gaussian() requires uniforms > 0, but RandomUniform() delivers >= 0.
      */
  do {
    u = drand(0, 1);
    v = drand(0, 1);
    if (u <= 0.0 || v <= 0.0) {
      u = 1.0;
      v = 1.0;
    }
    v = 1.7156 * (v - 0.5);

    /*  Evaluate the quadratic form */
    x = u - 0.449871;
    y = fabs(v) + 0.386595;
    q = x * x + y * (0.19600 * y - 0.25472 * x);

    /* Accept P if inside inner ellipse */
    if (q < 0.27597)
      break;

    /*  Reject P if outside outer ellipse, or outside acceptance region */
  } while ((q > 0.27846) || (v * v > -4.0 * log(u) * u * u));

  /*  Return ratio of P's coordinates as the normal deviate */
  return (mean + stddev * v / u);
}